

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O0

void CB_EXPLORE::predict_or_learn_cover<true>(cb_explore *data,single_learner *base,example *ec)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  __type_conflict _Var7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  v_array<COST_SENSITIVE::wclass> *this;
  v_array<unsigned_int> *this_00;
  float *pfVar11;
  cb_class *pcVar12;
  wclass *pwVar13;
  uint *puVar14;
  size_t sVar15;
  long in_RDX;
  ulong uVar16;
  long in_RDI;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float pseudo_cost;
  uint32_t j_1;
  size_t i_1;
  uint32_t i;
  float norm;
  float min_prob;
  float additive_probability;
  v_array<unsigned_int> *predictions;
  v_array<float> *probabilities;
  size_t counter;
  size_t cover_size;
  uint32_t j;
  action_scores probs;
  label *in_stack_000000d8;
  uint32_t num_actions;
  wclass *in_stack_ffffffffffffff08;
  v_array<COST_SENSITIVE::wclass> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  v_array<COST_SENSITIVE::wclass> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  float fVar21;
  undefined4 in_stack_ffffffffffffff2c;
  float local_cc;
  float local_a4;
  uint local_9c;
  v_array<ACTION_SCORE::action_score> *in_stack_ffffffffffffff68;
  ulong i_00;
  undefined4 in_stack_ffffffffffffff70;
  uint uVar22;
  undefined4 in_stack_ffffffffffffff74;
  uint local_44;
  
  uVar1 = *(uint *)(in_RDI + 0x10);
  uVar2 = *(undefined8 *)(in_RDX + 0x6850);
  uVar3 = *(undefined8 *)(in_RDX + 0x6858);
  uVar4 = *(undefined8 *)(in_RDX + 0x6860);
  uVar5 = *(undefined8 *)(in_RDX + 0x6868);
  v_array<ACTION_SCORE::action_score>::clear
            ((v_array<ACTION_SCORE::action_score> *)in_stack_ffffffffffffff10);
  v_array<COST_SENSITIVE::wclass>::clear(in_stack_ffffffffffffff10);
  for (local_44 = 0; local_44 < uVar1; local_44 = local_44 + 1) {
    v_array<COST_SENSITIVE::wclass>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  uVar6 = *(ulong *)(in_RDI + 0x120);
  this = (v_array<COST_SENSITIVE::wclass> *)(in_RDI + 0x80);
  this_00 = (v_array<unsigned_int> *)(in_RDI + 0x60);
  local_a4 = (float)uVar6;
  local_a4 = 1.0 / local_a4;
  fVar17 = 1.0 / (float)uVar1;
  _Var7 = std::sqrt<unsigned_long>(0x3072c0);
  fVar18 = 1.0 / (float)_Var7;
  pfVar11 = std::min<float>((float *)&stack0xffffffffffffff7c,(float *)&stack0xffffffffffffff78);
  fVar21 = *pfVar11;
  uVar8 = *(undefined8 *)(in_RDX + 0x6828);
  uVar9 = *(undefined8 *)(in_RDX + 0x6830);
  uVar10 = *(undefined8 *)(in_RDX + 0x6840);
  *(undefined8 *)(in_RDI + 0xb0) = *(undefined8 *)(in_RDX + 0x6838);
  *(undefined8 *)(in_RDI + 0xb8) = uVar10;
  *(undefined8 *)(in_RDI + 0xa0) = uVar8;
  *(undefined8 *)(in_RDI + 0xa8) = uVar9;
  uVar8 = *(undefined8 *)(in_RDI + 0xc0);
  uVar9 = *(undefined8 *)(in_RDI + 200);
  uVar10 = *(undefined8 *)(in_RDI + 0xd8);
  *(undefined8 *)(in_RDX + 0x6838) = *(undefined8 *)(in_RDI + 0xd0);
  *(undefined8 *)(in_RDX + 0x6840) = uVar10;
  *(undefined8 *)(in_RDX + 0x6828) = uVar8;
  *(undefined8 *)(in_RDX + 0x6830) = uVar9;
  get_cover_probabilities
            ((cb_explore *)CONCAT44(local_a4,fVar21),(single_learner *)CONCAT44(fVar17,fVar18),
             (example *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
  uVar8 = *(undefined8 *)(in_RDI + 0xa0);
  uVar9 = *(undefined8 *)(in_RDI + 0xa8);
  uVar10 = *(undefined8 *)(in_RDI + 0xb8);
  *(undefined8 *)(in_RDX + 0x6838) = *(undefined8 *)(in_RDI + 0xb0);
  *(undefined8 *)(in_RDX + 0x6840) = uVar10;
  *(undefined8 *)(in_RDX + 0x6828) = uVar8;
  *(undefined8 *)(in_RDX + 0x6830) = uVar9;
  LEARNER::learner<char,_example>::learn
            ((learner<char,_example> *)in_stack_ffffffffffffff20,
             (example *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             (size_t)in_stack_ffffffffffffff10);
  v_array<COST_SENSITIVE::wclass>::clear(in_stack_ffffffffffffff10);
  fVar17 = fVar21 * (float)uVar1;
  *(undefined8 *)(in_RDX + 0x6828) = *(undefined8 *)(in_RDI + 0xa0);
  *(undefined8 *)(in_RDX + 0x6830) = *(undefined8 *)(in_RDI + 0xa8);
  *(undefined8 *)(in_RDX + 0x6838) = *(undefined8 *)(in_RDI + 0xb0);
  *(undefined8 *)(in_RDX + 0x6840) = *(undefined8 *)(in_RDI + 0xb8);
  pcVar12 = GEN_CS::get_observed_cost
                      ((label *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  *(cb_class **)(in_RDI + 0x58) = pcVar12;
  GEN_CS::gen_cs_example<false>((cb_to_cs *)data,(example *)base,(label *)ec,in_stack_000000d8);
  for (uVar22 = 0; uVar22 < uVar1; uVar22 = uVar22 + 1) {
    pfVar11 = v_array<float>::operator[]((v_array<float> *)this,(ulong)uVar22);
    *pfVar11 = 0.0;
  }
  *(undefined8 *)(in_RDX + 0x6828) = *(undefined8 *)(in_RDI + 0xe0);
  *(undefined8 *)(in_RDX + 0x6830) = *(undefined8 *)(in_RDI + 0xe8);
  *(undefined8 *)(in_RDX + 0x6838) = *(undefined8 *)(in_RDI + 0xf0);
  *(undefined8 *)(in_RDX + 0x6840) = *(undefined8 *)(in_RDI + 0xf8);
  for (i_00 = 0; i_00 < uVar6; i_00 = i_00 + 1) {
    for (local_9c = 0; local_9c < uVar1; local_9c = local_9c + 1) {
      pwVar13 = v_array<COST_SENSITIVE::wclass>::operator[]
                          ((v_array<COST_SENSITIVE::wclass> *)(in_RDI + 0xc0),(ulong)local_9c);
      fVar18 = pwVar13->x;
      fVar19 = *(float *)(in_RDI + 0x128) * fVar21;
      pfVar11 = v_array<float>::operator[]((v_array<float> *)this,(ulong)local_9c);
      pfVar11 = std::max<float>(pfVar11,(float *)&stack0xffffffffffffff80);
      fVar20 = *pfVar11 / fVar17;
      pwVar13 = v_array<COST_SENSITIVE::wclass>::operator[]
                          ((v_array<COST_SENSITIVE::wclass> *)(in_RDI + 0xe0),(ulong)local_9c);
      pwVar13->class_index = local_9c + 1;
      pwVar13 = v_array<COST_SENSITIVE::wclass>::operator[]
                          ((v_array<COST_SENSITIVE::wclass> *)(in_RDI + 0xe0),(ulong)local_9c);
      pwVar13->x = (fVar18 - fVar19 / fVar20) + 1.0;
    }
    if (i_00 != 0) {
      LEARNER::learner<CB_EXPLORE::cb_explore,_example>::learn
                ((learner<CB_EXPLORE::cb_explore,_example> *)in_stack_ffffffffffffff20,
                 (example *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (size_t)in_stack_ffffffffffffff10);
    }
    in_stack_ffffffffffffff1c = local_a4;
    puVar14 = v_array<unsigned_int>::operator[](this_00,i_00);
    pfVar11 = v_array<float>::operator[]((v_array<float> *)this,(ulong)(*puVar14 - 1));
    if (fVar21 <= *pfVar11) {
      fVar17 = in_stack_ffffffffffffff1c + fVar17;
    }
    else {
      in_stack_ffffffffffffff20 = this;
      fVar18 = fVar21;
      fVar19 = in_stack_ffffffffffffff1c;
      puVar14 = v_array<unsigned_int>::operator[](this_00,i_00);
      pfVar11 = v_array<float>::operator[]
                          ((v_array<float> *)in_stack_ffffffffffffff20,(ulong)(*puVar14 - 1));
      in_stack_ffffffffffffff1c = in_stack_ffffffffffffff1c - (fVar21 - *pfVar11);
      uVar16 = (ulong)in_stack_ffffffffffffff1c;
      sVar15 = max(0,uVar16 | (long)(in_stack_ffffffffffffff1c - 9.223372e+18) &
                              (long)uVar16 >> 0x3f);
      local_cc = (float)sVar15;
      fVar17 = local_cc + fVar17;
      fVar21 = fVar18;
      in_stack_ffffffffffffff1c = fVar19;
    }
    in_stack_ffffffffffffff10 = this;
    local_a4 = in_stack_ffffffffffffff1c;
    puVar14 = v_array<unsigned_int>::operator[](this_00,i_00);
    pfVar11 = v_array<float>::operator[]
                        ((v_array<float> *)in_stack_ffffffffffffff10,(ulong)(*puVar14 - 1));
    *pfVar11 = in_stack_ffffffffffffff1c + *pfVar11;
  }
  *(undefined8 *)(in_RDX + 0x6828) = *(undefined8 *)(in_RDI + 0xa0);
  *(undefined8 *)(in_RDX + 0x6830) = *(undefined8 *)(in_RDI + 0xa8);
  *(undefined8 *)(in_RDX + 0x6838) = *(undefined8 *)(in_RDI + 0xb0);
  *(undefined8 *)(in_RDX + 0x6840) = *(undefined8 *)(in_RDI + 0xb8);
  *(undefined8 *)(in_RDX + 0x6850) = uVar2;
  *(undefined8 *)(in_RDX + 0x6858) = uVar3;
  *(undefined8 *)(in_RDX + 0x6860) = uVar4;
  *(undefined8 *)(in_RDX + 0x6868) = uVar5;
  return;
}

Assistant:

void predict_or_learn_cover(cb_explore& data, single_learner& base, example& ec)
{
  // Randomize over predictions from a base set of predictors
  // Use cost sensitive oracle to cover actions to form distribution.

  uint32_t num_actions = data.cbcs.num_actions;

  action_scores probs = ec.pred.a_s;
  probs.clear();
  data.cs_label.costs.clear();

  for (uint32_t j = 0; j < num_actions; j++) data.cs_label.costs.push_back({FLT_MAX, j + 1, 0., 0.});

  size_t cover_size = data.cover_size;
  size_t counter = data.counter;
  v_array<float>& probabilities = data.cover_probs;
  v_array<uint32_t>& predictions = data.preds;

  float additive_probability = 1.f / (float)cover_size;

  float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(counter * num_actions));

  data.cb_label = ec.l.cb;

  ec.l.cs = data.cs_label;
  get_cover_probabilities(data, base, ec, probs);

  if (is_learn)
  {
    ec.l.cb = data.cb_label;
    base.learn(ec);

    // Now update oracles

    // 1. Compute loss vector
    data.cs_label.costs.clear();
    float norm = min_prob * num_actions;
    ec.l.cb = data.cb_label;
    data.cbcs.known_cost = get_observed_cost(data.cb_label);
    gen_cs_example<false>(data.cbcs, ec, data.cb_label, data.cs_label);
    for (uint32_t i = 0; i < num_actions; i++) probabilities[i] = 0;

    ec.l.cs = data.second_cs_label;
    // 2. Update functions
    for (size_t i = 0; i < cover_size; i++)
    {
      // Create costs of each action based on online cover
      for (uint32_t j = 0; j < num_actions; j++)
      {
        float pseudo_cost =
            data.cs_label.costs[j].x - data.psi * min_prob / (max(probabilities[j], min_prob) / norm) + 1;
        data.second_cs_label.costs[j].class_index = j + 1;
        data.second_cs_label.costs[j].x = pseudo_cost;
      }
      if (i != 0)
        data.cs->learn(ec, i + 1);
      if (probabilities[predictions[i] - 1] < min_prob)
        norm += max(0, additive_probability - (min_prob - probabilities[predictions[i] - 1]));
      else
        norm += additive_probability;
      probabilities[predictions[i] - 1] += additive_probability;
    }
  }

  ec.l.cb = data.cb_label;
  ec.pred.a_s = probs;
}